

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O1

RenderContext * __thiscall
eglu::GLContextFactory::createContext
          (GLContextFactory *this,RenderConfig *config,CommandLine *cmdLine)

{
  Functions *this_00;
  NativeDisplay *nativeDisplay;
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  uint uVar8;
  uint uVar9;
  NativeDisplayFactory *factory;
  NativeWindowFactory *windowFactory;
  NativePixmapFactory *pNVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  _func_int **pp_Var12;
  Library *egl;
  NativePixmap *pixmap;
  undefined4 extraout_var_00;
  DynamicLibrary *this_01;
  InternalError *this_02;
  NotSupportedError *this_03;
  char *fileName;
  SurfaceType SVar13;
  WindowSurfacePair WVar14;
  EGLint major;
  EGLint minor;
  EGLint numSamples;
  EGLint stencilBits;
  EGLint depthBits;
  EGLint height;
  EGLint width;
  undefined1 local_98 [12];
  int iStack_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  int local_78;
  PixelFormat local_68;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  _func_int **local_40;
  RenderTarget *local_38;
  
  factory = selectNativeDisplayFactory(this->m_displayFactoryRegistry,cmdLine);
  windowFactory = selectNativeWindowFactory(factory,cmdLine);
  pNVar10 = selectNativePixmapFactory(factory,cmdLine);
  pRVar11 = (RenderContext *)operator_new(0x1ad8);
  pRVar11->_vptr_RenderContext = (_func_int **)&PTR__RenderContext_0215cbb8;
  pp_Var12 = *(_func_int ***)&config->height;
  pp_Var1 = *(_func_int ***)&config->windowVisibility;
  pp_Var2 = *(_func_int ***)&config->redBits;
  pp_Var3 = *(_func_int ***)&config->blueBits;
  pp_Var4 = *(_func_int ***)&config->depthBits;
  pRVar11[1]._vptr_RenderContext = *(_func_int ***)config;
  pRVar11[2]._vptr_RenderContext = pp_Var12;
  pRVar11[3]._vptr_RenderContext = pp_Var1;
  pRVar11[4]._vptr_RenderContext = pp_Var2;
  pRVar11[5]._vptr_RenderContext = pp_Var3;
  pRVar11[6]._vptr_RenderContext = pp_Var4;
  pRVar11[7]._vptr_RenderContext = *(_func_int ***)&config->numSamples;
  pRVar11[8]._vptr_RenderContext = (_func_int **)windowFactory;
  local_38 = (RenderTarget *)(pRVar11 + 0x10);
  pRVar11[0xb]._vptr_RenderContext = (_func_int **)0x0;
  pRVar11[0xc]._vptr_RenderContext = (_func_int **)0x0;
  pRVar11[9]._vptr_RenderContext = (_func_int **)0x0;
  pRVar11[10]._vptr_RenderContext = (_func_int **)0x0;
  pRVar11[0xe]._vptr_RenderContext = (_func_int **)0x0;
  pRVar11[0xf]._vptr_RenderContext = (_func_int **)0x0;
  tcu::RenderTarget::RenderTarget(local_38);
  pRVar11[0x15]._vptr_RenderContext = (_func_int **)0x0;
  this_00 = (Functions *)(pRVar11 + 0x16);
  glw::Functions::Functions(this_00);
  SVar13 = config->surfaceType;
  iVar6 = (*(factory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])(factory,0);
  pRVar11[9]._vptr_RenderContext = (_func_int **)CONCAT44(extraout_var,iVar6);
  pp_Var12 = (_func_int **)getDisplay((NativeDisplay *)CONCAT44(extraout_var,iVar6));
  pRVar11[0xc]._vptr_RenderContext = pp_Var12;
  egl = (Library *)(**(code **)(*pRVar11[9]._vptr_RenderContext + 0x10))();
  local_98._0_8_ = (ulong)(uint)local_98._4_4_ << 0x20;
  local_68._0_8_ = (ulong)(uint)local_68.greenBits << 0x20;
  (*egl->_vptr_Library[0x25])(egl,pRVar11[0xc]._vptr_RenderContext);
  dVar7 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar7,"initialize(m_eglDisplay, &major, &minor)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x142);
  pp_Var12 = (_func_int **)chooseConfig(egl,pRVar11[0xc]._vptr_RenderContext,config);
  pRVar11[0xd]._vptr_RenderContext = pp_Var12;
  if (SVar13 == SURFACETYPE_DONT_CARE) {
    uVar8 = getConfigAttribInt(egl,pRVar11[0xc]._vptr_RenderContext,pp_Var12,0x3033);
    SVar13 = SURFACETYPE_WINDOW;
    if ((((uVar8 & 4) == 0) && (SVar13 = SURFACETYPE_OFFSCREEN_GENERIC, (uVar8 & 1) == 0)) &&
       (SVar13 = SURFACETYPE_OFFSCREEN_NATIVE, (uVar8 & 2) == 0)) {
      this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_03,"Selected EGL config doesn\'t support any surface types",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x153);
      goto LAB_00e9c71a;
    }
  }
  if (SVar13 == SURFACETYPE_OFFSCREEN_GENERIC) {
    local_98._4_4_ = config->width;
    if (local_98._4_4_ == -1) {
      local_98._4_4_ = 0x200;
    }
    iVar6 = config->height;
    if (config->height == -1) {
      iVar6 = 0x200;
    }
    local_98._0_4_ = 0x3057;
    stack0xffffffffffffff70 = (Library *)CONCAT44(iVar6,0x3056);
    local_88._M_allocated_capacity._0_4_ = 0x3038;
    iVar6 = (*egl->_vptr_Library[10])
                      (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext);
    pp_Var12 = (_func_int **)CONCAT44(extraout_var_00,iVar6);
    dVar7 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar7,"eglCreatePbufferSurface()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x123);
  }
  else if (SVar13 == SURFACETYPE_OFFSCREEN_NATIVE) {
    if (pNVar10 == (NativePixmapFactory *)0x0) {
      this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_03,"EGL platform doesn\'t support pixmaps",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x16e);
      goto LAB_00e9c71a;
    }
    nativeDisplay = (NativeDisplay *)pRVar11[9]._vptr_RenderContext;
    local_40 = pRVar11[0xc]._vptr_RenderContext;
    pp_Var12 = pRVar11[0xd]._vptr_RenderContext;
    local_98._0_8_ = (pointer)0x3038;
    pixmap = (NativePixmap *)(**(code **)(*(long *)pNVar10 + 0x20))(pNVar10,nativeDisplay);
    pp_Var12 = (_func_int **)
               createPixmapSurface(nativeDisplay,pixmap,local_40,pp_Var12,(EGLAttrib *)local_98);
    pRVar11[0xb]._vptr_RenderContext = (_func_int **)pixmap;
  }
  else {
    if (SVar13 != SURFACETYPE_WINDOW) {
      this_02 = (InternalError *)__cxa_allocate_exception(0x38);
      local_98._0_8_ = &local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Invalid surface type","");
      tcu::InternalError::InternalError(this_02,(string *)local_98);
      __cxa_throw(this_02,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    if (windowFactory == (NativeWindowFactory *)0x0) {
      this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_03,"EGL platform doesn\'t support windows",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x161);
LAB_00e9c71a:
      __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    WVar14 = anon_unknown_1::createWindow
                       ((NativeDisplay *)pRVar11[9]._vptr_RenderContext,windowFactory,
                        pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,config);
    pp_Var12 = (_func_int **)WVar14.second;
    pRVar11[10]._vptr_RenderContext = (_func_int **)WVar14.first;
  }
  pRVar11[0xe]._vptr_RenderContext = pp_Var12;
  pp_Var12 = (_func_int **)
             createGLContext(egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,
                             &config->type,config->resetNotificationStrategy);
  pRVar11[0xf]._vptr_RenderContext = pp_Var12;
  (*egl->_vptr_Library[0x27])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xe]._vptr_RenderContext,
             pRVar11[0xe]._vptr_RenderContext,pp_Var12);
  dVar7 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar7,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x17c);
  pp_Var12 = pRVar11[0xc]._vptr_RenderContext;
  local_68.redBits = 0x1e;
  local_68.greenBits = 0;
  local_98._0_8_ = &local_88;
  local_98._0_8_ = std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_68);
  local_88._M_allocated_capacity._0_4_ = local_68.redBits;
  local_88._M_allocated_capacity._4_4_ = local_68.greenBits;
  *(char *)(local_98._0_8_ + 0xe) = 'l';
  *(char *)(local_98._0_8_ + 0xf) = '_';
  *(char *)(local_98._0_8_ + 0x10) = 'p';
  *(char *)(local_98._0_8_ + 0x11) = 'r';
  *(char *)(local_98._0_8_ + 0x12) = 'o';
  *(char *)(local_98._0_8_ + 0x13) = 'c';
  *(char *)(local_98._0_8_ + 0x14) = '_';
  *(char *)(local_98._0_8_ + 0x15) = 'a';
  *(char *)(local_98._0_8_ + 0x16) = 'd';
  *(char *)(local_98._0_8_ + 0x17) = 'd';
  *(char *)(local_98._0_8_ + 0x18) = 'r';
  *(char *)(local_98._0_8_ + 0x19) = 'e';
  *(char *)(local_98._0_8_ + 0x1a) = 's';
  *(char *)(local_98._0_8_ + 0x1b) = 's';
  *(char *)(local_98._0_8_ + 0x1c) = 'e';
  *(char *)(local_98._0_8_ + 0x1d) = 's';
  *(undefined8 *)local_98._0_8_ = 0x5f52484b5f4c4745;
  *(char *)(local_98._0_8_ + 8) = 'g';
  *(char *)(local_98._0_8_ + 9) = 'e';
  *(char *)(local_98._0_8_ + 10) = 't';
  *(char *)(local_98._0_8_ + 0xb) = '_';
  *(char *)(local_98._0_8_ + 0xc) = 'a';
  *(char *)(local_98._0_8_ + 0xd) = 'l';
  *(char *)(local_98._0_8_ + 0xe) = 'l';
  *(char *)(local_98._0_8_ + 0xf) = '_';
  local_98._8_4_ = local_68.redBits;
  iStack_8c = local_68.greenBits;
  *(char *)(local_98._0_8_ + local_68._0_8_) = '\0';
  bVar5 = hasExtension(egl,pp_Var12,(string *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
  }
  if (bVar5) {
    local_98._0_8_ = &PTR_get_0215cc48;
    unique0x10000fe5 = egl;
    glu::initCoreFunctions
              (this_00,(FunctionLoader *)local_98,
               (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
  }
  else {
    uVar8 = (config->type).super_ApiType.m_bits;
    uVar9 = uVar8 & 0x3ff;
    if (uVar9 == 3) {
      glw::initES30Direct(this_00);
    }
    else if (uVar9 == 2) {
      glw::initES20Direct(this_00);
    }
    else {
      this_01 = (DynamicLibrary *)operator_new(8);
      fileName = "libGL.so";
      if ((uVar8 & 0x300) == 0) {
        fileName = "libGLESv2.so";
      }
      de::DynamicLibrary::DynamicLibrary(this_01,fileName);
      pRVar11[0x15]._vptr_RenderContext = (_func_int **)this_01;
      local_98._0_8_ = &PTR_get_0215cc78;
      unique0x10000fdd = (Library *)this_01;
      glu::initCoreFunctions
                (this_00,(FunctionLoader *)local_98,
                 (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
    }
  }
  local_98._0_8_ = &PTR_get_0215cc48;
  unique0x10000fed = egl;
  glu::initExtensionFunctions
            (this_00,(FunctionLoader *)local_98,
             (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
  local_68.redBits = 0;
  local_68.greenBits = 0;
  local_68.blueBits = 0;
  local_68.alphaBits = 0;
  (*egl->_vptr_Library[0x2b])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xe]._vptr_RenderContext,0x3057,&local_44)
  ;
  (*egl->_vptr_Library[0x2b])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xe]._vptr_RenderContext,0x3056,&local_48)
  ;
  (*egl->_vptr_Library[0x19])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,0x3024,&local_68)
  ;
  (*egl->_vptr_Library[0x19])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,0x3023,
             &local_68.greenBits);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,0x3022,
             &local_68.blueBits);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,0x3021,
             &local_68.alphaBits);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,0x3025,&local_4c)
  ;
  (*egl->_vptr_Library[0x19])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,0x3026,&local_50)
  ;
  (*egl->_vptr_Library[0x19])
            (egl,pRVar11[0xc]._vptr_RenderContext,pRVar11[0xd]._vptr_RenderContext,0x3031,&local_54)
  ;
  dVar7 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar7,"Failed to query config attributes",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x1c8);
  tcu::RenderTarget::RenderTarget
            ((RenderTarget *)local_98,local_44,local_48,&local_68,local_4c,local_50,local_54);
  local_38->m_numSamples = local_78;
  (local_38->m_pixelFormat).blueBits = local_88._M_allocated_capacity._0_4_;
  (local_38->m_pixelFormat).alphaBits = local_88._M_allocated_capacity._4_4_;
  local_38->m_depthBits = local_88._8_4_;
  local_38->m_stencilBits = local_88._12_4_;
  local_38->m_width = local_98._0_4_;
  local_38->m_height = local_98._4_4_;
  *(Library **)&local_38->m_pixelFormat = stack0xffffffffffffff70;
  return pRVar11;
}

Assistant:

glu::RenderContext* GLContextFactory::createContext (const glu::RenderConfig& config, const tcu::CommandLine& cmdLine) const
{
	const NativeDisplayFactory& displayFactory = selectNativeDisplayFactory(m_displayFactoryRegistry, cmdLine);

	const NativeWindowFactory*	windowFactory;
	const NativePixmapFactory*	pixmapFactory;

	try
	{
		windowFactory = &selectNativeWindowFactory(displayFactory, cmdLine);
	}
	catch (const tcu::NotSupportedError&)
	{
		windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &selectNativePixmapFactory(displayFactory, cmdLine);
	}
	catch (const tcu::NotSupportedError&)
	{
		pixmapFactory = DE_NULL;
	}

	return new RenderContext(&displayFactory, windowFactory, pixmapFactory, config);
}